

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber
          (ONX_Model *this,uint managed_font_serial_number,double model_space_text_scale,
          bool bIgnoreSystemDimStyles)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *mcr;
  bool bVar2;
  bool in_CL;
  uint managed_font_sn;
  undefined7 in_register_00000011;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *mcr_00;
  ON_ModelComponentReference OVar4;
  
  managed_font_sn = (uint)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles);
  mcr_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(in_register_00000034,managed_font_serial_number) + 0x8b8);
  bVar2 = Internal_DimStyleHasFont
                    ((ON_ModelComponentReference *)mcr_00,managed_font_sn,model_space_text_scale,
                     in_CL);
  if (!bVar2) {
    lVar1 = *(long *)(CONCAT44(in_register_00000034,managed_font_serial_number) + 0x8c8);
    lVar3 = 0xc0;
    if (*(int *)(lVar1 + 0x20) < 9) {
      lVar3 = 0;
    }
    mcr = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(lVar1 + 0x18) + 8 + lVar3);
    while ((mcr_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     &ON_ModelComponentReference::Empty,
           mcr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
           (bVar2 = Internal_DimStyleHasFont
                              ((ON_ModelComponentReference *)mcr,managed_font_sn,
                               model_space_text_scale,in_CL), mcr_00 = mcr, !bVar2))) {
      mcr = (((ON_ModelComponentReference *)(mcr + 1))->m_sp).
            super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,(ON_ModelComponentReference *)mcr_00);
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::FirstDimensionStyleFromManagedFontSerialNumber(
  unsigned int managed_font_serial_number,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
) const
{
  if (Internal_DimStyleHasFont(m_default_dimension_style, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
    return m_default_dimension_style;

  for (
    ONX_ModelComponentReferenceLink* link = Internal_ComponentListConst(ON_ModelComponent::Type::DimStyle).m_first_mcr_link;
    nullptr != link;
    link = link->m_next
    )
  {
    if (Internal_DimStyleHasFont(link->m_mcr, managed_font_serial_number, model_space_text_scale, bIgnoreSystemDimStyles))
      return link->m_mcr;
  }

  return ON_ModelComponentReference::Empty;
}